

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_impl.cpp
# Opt level: O3

MPP_RET enc_impl_add_prefix(EncImpl impl,MppPacket pkt,RK_S32 *length,RK_U8 *uuid,void *data,
                           RK_S32 size)

{
  code *UNRECOVERED_JUMPTABLE;
  MPP_RET MVar1;
  undefined8 in_RAX;
  
  if (pkt == (MppPacket)0x0 || data == (void *)0x0) {
    _mpp_log_l(2,"enc_impl","found NULL input\n","enc_impl_add_prefix",data,size,
               CONCAT71((int7)((ulong)in_RAX >> 8),pkt != (MppPacket)0x0));
    return MPP_ERR_NULL_PTR;
  }
  UNRECOVERED_JUMPTABLE = *(code **)(*(long *)((long)impl + 0x18) + 0x50);
  if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
    MVar1 = (*UNRECOVERED_JUMPTABLE)(pkt,length,uuid,data,size);
    return MVar1;
  }
  return MPP_OK;
}

Assistant:

MPP_RET enc_impl_add_prefix(EncImpl impl, MppPacket pkt, RK_S32 *length,
                            RK_U8 uuid[16], const void *data, RK_S32 size)
{
    if (NULL == pkt || NULL == data) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MPP_RET ret = MPP_OK;
    EncImplCtx *p = (EncImplCtx *)impl;

    if (NULL == p->api->add_prefix)
        return ret;

    if (p->api->add_prefix)
        ret = p->api->add_prefix(pkt, length, uuid, data, size);

    return ret;
}